

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.h
# Opt level: O0

int cpu_mmu_index(CPUTriCoreState *env,_Bool ifetch)

{
  _Bool ifetch_local;
  CPUTriCoreState *env_local;
  
  return 0;
}

Assistant:

static inline int cpu_mmu_index(CPUSPARCState *env, bool ifetch)
{
#if !defined(TARGET_SPARC64)
    if ((env->mmuregs[0] & MMU_E) == 0) { /* MMU disabled */
        return MMU_PHYS_IDX;
    } else {
        return env->psrs;
    }
#else
    /* IMMU or DMMU disabled.  */
    if (ifetch
        ? (env->lsu & IMMU_E) == 0 || (env->pstate & PS_RED) != 0
        : (env->lsu & DMMU_E) == 0) {
        return MMU_PHYS_IDX;
    } else if (cpu_hypervisor_mode(env)) {
        return MMU_PHYS_IDX;
    } else if (env->tl > 0) {
        return MMU_NUCLEUS_IDX;
    } else if (cpu_supervisor_mode(env)) {
        return MMU_KERNEL_IDX;
    } else {
        return MMU_USER_IDX;
    }
#endif
}